

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_1_conditional_expr(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode **ppPVar1;
  PVIPNode *pPVar2;
  
  ppPVar1 = G->val;
  pPVar2 = PVIP_node_new_children3
                     (&G->data,PVIP_NODE_CONDITIONAL,ppPVar1[-3],ppPVar1[-2],ppPVar1[-1]);
  G->ss = pPVar2;
  return;
}

Assistant:

YY_ACTION(void) yy_1_conditional_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define e3 G->val[-1]
#define e2 G->val[-2]
#define e1 G->val[-3]
  yyprintf((stderr, "do yy_1_conditional_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children3(&(G->data), PVIP_NODE_CONDITIONAL, e1, e2, e3); }\n"));
  yy = PVIP_node_new_children3(&(G->data), PVIP_NODE_CONDITIONAL, e1, e2, e3); ;
#undef e3
#undef e2
#undef e1
}